

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::HandleTransitionProperty(Element *this)

{
  const_iterator __last;
  ElementAnimation *pEVar1;
  bool bVar2;
  Vector<Transition> *in_RAX;
  TransitionList *pTVar3;
  ElementAnimation *__b;
  ElementAnimation *pEVar4;
  iterator it;
  pointer pEVar5;
  const_iterator cVar6;
  const_iterator __first;
  anon_class_8_1_d334f119 local_38;
  
  if ((this->field_0x17 & 0x10) == 0) {
    return;
  }
  this->field_0x17 = this->field_0x17 & 0xef;
  local_38.keep_transitions_list = in_RAX;
  pTVar3 = Style::ComputedValues::transition(&this->meta->computed_values);
  if (pTVar3 != (TransitionList *)0x0) {
    if (pTVar3->all != false) {
      return;
    }
    if (pTVar3->none != true) {
      local_38.keep_transitions_list = &pTVar3->transitions;
      pEVar5 = (this->animations).
               super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__first._M_current =
                (this->animations).
                super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
                _M_impl.super__Vector_impl_data._M_start; __first._M_current != pEVar5;
          __first._M_current = __first._M_current + 1) {
        bVar2 = HandleTransitionProperty::anon_class_8_1_d334f119::operator()
                          (&local_38,__first._M_current);
        if (!bVar2) {
          do {
            pEVar5 = pEVar5 + -1;
            if (pEVar5 == __first._M_current) goto LAB_0027e7aa;
            bVar2 = HandleTransitionProperty::anon_class_8_1_d334f119::operator()(&local_38,pEVar5);
          } while (!bVar2);
          ::std::swap<Rml::ElementAnimation>(__first._M_current,pEVar5);
        }
      }
      goto LAB_0027e7aa;
    }
  }
  __b = (this->animations).
        super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
        super__Vector_impl_data._M_finish;
  pEVar5 = (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_start;
  while (__first._M_current = pEVar5, __first._M_current != __b) {
    pEVar4 = __b;
    pEVar5 = __first._M_current + 1;
    if ((__first._M_current)->origin == Transition) {
      do {
        __b = pEVar4 + -1;
        if (__b == __first._M_current) goto LAB_0027e7aa;
        pEVar1 = pEVar4 + -1;
        pEVar4 = __b;
      } while (pEVar1->origin == Transition);
      ::std::swap<Rml::ElementAnimation>(__first._M_current,__b);
    }
  }
LAB_0027e7aa:
  for (cVar6._M_current = __first._M_current;
      __last._M_current =
           (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_finish, cVar6._M_current != __last._M_current;
      cVar6._M_current = cVar6._M_current + 1) {
    RemoveProperty(this,(cVar6._M_current)->property_id);
  }
  ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::erase
            (&this->animations,__first,__last);
  return;
}

Assistant:

void Element::HandleTransitionProperty()
{
	if (dirty_transition)
	{
		dirty_transition = false;

		// Remove all transitions that are no longer in our local list
		const TransitionList* keep_transitions = GetComputedValues().transition();

		if (keep_transitions && keep_transitions->all)
			return;

		auto it_remove = animations.end();

		if (!keep_transitions || keep_transitions->none)
		{
			// All transitions should be removed, but only touch the animations that originate from the 'transition' property.
			// Move all animations to be erased in a valid state at the end of the list, and erase later.
			it_remove = std::partition(animations.begin(), animations.end(),
				[](const ElementAnimation& animation) -> bool { return !animation.IsTransition(); });
		}
		else
		{
			RMLUI_ASSERT(keep_transitions);

			// Only remove the transitions that are not in our keep list.
			const auto& keep_transitions_list = keep_transitions->transitions;

			it_remove = std::partition(animations.begin(), animations.end(), [&keep_transitions_list](const ElementAnimation& animation) -> bool {
				if (!animation.IsTransition())
					return true;
				auto it = std::find_if(keep_transitions_list.begin(), keep_transitions_list.end(),
					[&animation](const Transition& transition) { return animation.GetPropertyId() == transition.id; });
				bool keep_animation = (it != keep_transitions_list.end());
				return keep_animation;
			});
		}

		// We can decide what to do with cancelled transitions here.
		for (auto it = it_remove; it != animations.end(); ++it)
			RemoveProperty(it->GetPropertyId());

		animations.erase(it_remove, animations.end());
	}
}